

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moremagic.c
# Opt level: O2

void spell_remove_taint(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((*(byte *)((long)vo + 0xa0) & 0x10) == 0) {
    send_to_char("It is not tainted by evil.\n\r",ch);
    return;
  }
  iVar2 = get_skill(ch,sn);
  iVar3 = level - *(short *)((long)vo + 0x108);
  iVar1 = iVar3 + -0x3c;
  if (*(short *)((long)vo + 0x108) < 0x3c) {
    iVar1 = iVar3;
  }
  iVar3 = number_percent();
  if (iVar3 < iVar1 + iVar2 / 2) {
    act("The sickly red aura of $p fades away.",ch,vo,(void *)0x0,4);
    *(byte *)((long)vo + 0xa0) = *(byte *)((long)vo + 0xa0) & 0xef;
    return;
  }
  act("$p shivers softly, but the sickly red aura remains.",ch,vo,(void *)0x0,4);
  return;
}

Assistant:

void spell_remove_taint(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	int chance;

	if (!IS_SET(obj->extra_flags, ITEM_EVIL))
	{
		send_to_char("It is not tainted by evil.\n\r", ch);
		return;
	}

	chance = get_skill(ch, sn) / 2;
	chance += level - obj->level;

	if (obj->level >= MAX_LEVEL)
		chance -= MAX_LEVEL;

	if (number_percent() < chance)
	{
		act("The sickly red aura of $p fades away.", ch, obj, nullptr, TO_ALL);
		REMOVE_BIT(obj->extra_flags, ITEM_EVIL);
	}
	else
	{
		act("$p shivers softly, but the sickly red aura remains.", ch, obj, nullptr, TO_ALL);
	}
}